

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O2

void timing_web_validate(Am_Web_Events *events)

{
  bool bVar1;
  Am_Slot_Key AVar2;
  uint uVar3;
  Am_Value *pAVar4;
  ulong uVar5;
  unsigned_long uVar6;
  Am_Wrapper *pAVar7;
  float fVar8;
  Am_Object self;
  Am_Time fixed_duration;
  Am_Time duration;
  Am_Slot slot;
  Am_Object local_68;
  float local_5c;
  Am_Object local_58;
  float local_4c;
  Am_Time local_48;
  Am_Time local_40;
  Am_Slot local_38;
  
  Am_Web_Events::Start(events);
  local_38 = Am_Web_Events::Get(events);
  Am_Slot::Get_Owner((Am_Slot *)&local_58);
  Am_Object::Am_Object(&local_68,&local_58);
  Am_Object::~Am_Object(&local_58);
  pAVar4 = Am_Object::Get(&local_68,0xfc,0);
  local_5c = Am_Value::operator_cast_to_float(pAVar4);
  pAVar4 = Am_Object::Get(&local_68,0xfd,0);
  Am_Time::Am_Time((Am_Time *)&local_58,pAVar4);
  Am_Time::Am_Time(&local_48,(Am_Time *)&local_58);
  pAVar4 = Am_Object::Get(&local_68,0xf8,0);
  fVar8 = Am_Value::operator_cast_to_float(pAVar4);
  pAVar4 = Am_Object::Get(&local_68,0x100,0);
  uVar3 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Web_Events::Start(events);
  fVar8 = fVar8 * 1000.0;
  local_4c = local_5c;
  do {
    bVar1 = Am_Web_Events::Last(events);
    if (bVar1) {
      Am_Object::Set(&local_68,0xfc,local_5c,0);
      pAVar7 = Am_Time::operator_cast_to_Am_Wrapper_((Am_Time *)&local_58);
      Am_Object::Set(&local_68,0xfd,pAVar7,0);
      Am_Object::Set(&local_68,0xfe,local_4c,0);
      pAVar7 = Am_Time::operator_cast_to_Am_Wrapper_(&local_48);
      Am_Object::Set(&local_68,0xff,pAVar7,0);
      Am_Object::Set(&local_68,0x100,uVar3 & 0xffff,0);
      Am_Time::~Am_Time(&local_48);
      Am_Time::~Am_Time((Am_Time *)&local_58);
      Am_Object::~Am_Object(&local_68);
      return;
    }
    local_38 = Am_Web_Events::Get(events);
    AVar2 = Am_Slot::Get_Key(&local_38);
    switch(AVar2) {
    case 0xf8:
    case 0x100:
      if ((short)uVar3 == 0xfc) {
        uVar5 = (ulong)(fVar8 / local_5c);
        Am_Time::Am_Time(&local_40,
                         (long)(fVar8 / local_5c - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5);
        Am_Time::operator=(&local_48,&local_40);
LAB_001a1128:
        Am_Time::~Am_Time(&local_40);
        uVar3 = 0xfc;
      }
      else {
        uVar6 = Am_Time::Milliseconds((Am_Time *)&local_58);
        local_4c = fVar8 / (float)uVar6;
      }
      break;
    case 0xfc:
      if (0.0 < local_5c) {
        uVar5 = (ulong)(fVar8 / local_5c);
        Am_Time::Am_Time(&local_40,
                         (long)(fVar8 / local_5c - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5);
        Am_Time::operator=(&local_48,&local_40);
        Am_Time::~Am_Time(&local_40);
        Am_Time::Am_Time(&local_40,0);
        Am_Time::operator=((Am_Time *)&local_58,&local_40);
        goto LAB_001a1128;
      }
      break;
    case 0xfd:
      bVar1 = Am_Time::Valid((Am_Time *)&local_58);
      if ((bVar1) && (uVar6 = Am_Time::Milliseconds((Am_Time *)&local_58), uVar6 != 0)) {
        uVar6 = Am_Time::Milliseconds((Am_Time *)&local_58);
        local_4c = fVar8 / (float)uVar6;
        uVar3 = 0xfd;
        local_5c = 0.0;
      }
    }
    Am_Web_Events::Next(events);
  } while( true );
}

Assistant:

void
timing_web_validate(Am_Web_Events &events)
{
  events.Start();
  Am_Slot slot = events.Get();
  Am_Object self = slot.Get_Owner();
  float fixed_velocity = self.Get(Am_VELOCITY);
  Am_Time fixed_duration = self.Get(Am_DURATION);
  float velocity = fixed_velocity;
  Am_Time duration = fixed_duration;
  float length = self.Get(Am_PATH_LENGTH);
  Am_Slot_Key timing_mode = (int)self.Get(Am_TIMING_MODE);

  events.Start();
  while (!events.Last()) {
    slot = events.Get();
    switch (slot.Get_Key()) {
    case Am_VELOCITY:
      // std::cout << self << " VELOCITY <- " << velocity <<std::endl;
      if (fixed_velocity > 0) {
        duration = Am_Time((unsigned long)((1000 * length) / fixed_velocity));
        fixed_duration = Am_Time((unsigned long)0);
        timing_mode = Am_VELOCITY;
      }
      break;

    case Am_DURATION:
      // std::cout << self << " DURATION <- " << duration <<std::endl;
      if (fixed_duration.Valid() && fixed_duration.Milliseconds() > 0) {
        velocity = (1000 * length) / (float)fixed_duration.Milliseconds();
        fixed_velocity = 0;
        timing_mode = Am_DURATION;
      }
      break;

    case Am_PATH_LENGTH:
    case Am_TIMING_MODE:
      // std::cout << self << " LENGTH <- " << length <<std::endl;
      if (timing_mode == Am_VELOCITY) {
        // std::cout << "\tMODE = velocity" <<std::endl;
        duration = Am_Time((unsigned long)(1000 * length / fixed_velocity));
      } else {
        // std::cout << "\tMODE = duration" <<std::endl;
        velocity = (1000 * length) / (float)fixed_duration.Milliseconds();
      }
      break;
    }
    events.Next();
  }
  self.Set(Am_VELOCITY, fixed_velocity);
  self.Set(Am_DURATION, fixed_duration);
  self.Set(Am_CURRENT_VELOCITY, velocity);
  self.Set(Am_CURRENT_DURATION, duration);
  self.Set(Am_TIMING_MODE, (int)timing_mode);
}